

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlCatalogAdd(xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  xmlCatalogPrefer xVar1;
  int iVar2;
  xmlCatalogPtr pxVar3;
  xmlCatalogEntryPtr pxVar4;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalogData();
  }
  xmlRMutexLock(xmlCatalogMutex);
  if ((xmlDefaultCatalog == (xmlCatalogPtr)0x0) &&
     (iVar2 = xmlStrEqual(type,"catalog"), xVar1 = xmlCatalogDefaultPrefer, iVar2 != 0)) {
    pxVar3 = (xmlCatalogPtr)(*xmlMalloc)(0x78);
    if (pxVar3 == (xmlCatalogPtr)0x0) {
      xmlCatalogErrMemory("allocating catalog");
      xmlDefaultCatalog = (xmlCatalogPtr)0x0;
      iVar2 = 0;
    }
    else {
      *(undefined8 *)pxVar3 = 0;
      pxVar3->catalTab[0] = (char *)0x0;
      pxVar3->catalTab[9] = (char *)0x0;
      pxVar3->catalNr = 0;
      pxVar3->catalMax = 0;
      pxVar3->sgml = (xmlHashTablePtr)0x0;
      *(undefined8 *)&pxVar3->prefer = 0;
      pxVar3->catalTab[7] = (char *)0x0;
      pxVar3->catalTab[8] = (char *)0x0;
      pxVar3->catalTab[5] = (char *)0x0;
      pxVar3->catalTab[6] = (char *)0x0;
      pxVar3->catalTab[3] = (char *)0x0;
      pxVar3->catalTab[4] = (char *)0x0;
      pxVar3->catalTab[1] = (char *)0x0;
      pxVar3->catalTab[2] = (char *)0x0;
      pxVar3->xml = (xmlCatalogEntryPtr)0x0;
      pxVar3->type = XML_XML_CATALOG_TYPE;
      pxVar3->catalMax = 10;
      pxVar3->prefer = xVar1;
      iVar2 = 0;
      xmlDefaultCatalog = pxVar3;
      pxVar4 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,orig,(xmlChar *)0x0,
                                  xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
      xmlDefaultCatalog->xml = pxVar4;
    }
  }
  else {
    iVar2 = xmlACatalogAdd(xmlDefaultCatalog,type,orig,replace);
  }
  xmlRMutexUnlock(xmlCatalogMutex);
  return iVar2;
}

Assistant:

int
xmlCatalogAdd(const xmlChar *type, const xmlChar *orig, const xmlChar *replace) {
    int res = -1;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalogData();

    xmlRMutexLock(xmlCatalogMutex);
    /*
     * Specific case where one want to override the default catalog
     * put in place by xmlInitializeCatalog();
     */
    if ((xmlDefaultCatalog == NULL) &&
	(xmlStrEqual(type, BAD_CAST "catalog"))) {
	xmlDefaultCatalog = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		                          xmlCatalogDefaultPrefer);
	if (xmlDefaultCatalog != NULL) {
	   xmlDefaultCatalog->xml = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				    orig, NULL,  xmlCatalogDefaultPrefer, NULL);
	}
	xmlRMutexUnlock(xmlCatalogMutex);
	return(0);
    }

    res = xmlACatalogAdd(xmlDefaultCatalog, type, orig, replace);
    xmlRMutexUnlock(xmlCatalogMutex);
    return(res);
}